

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_harbor.c
# Opt level: O3

void dispatch_queue(harbor *h,int id)

{
  int fd;
  int iVar1;
  harbor_msg_queue *queue;
  harbor_msg *phVar2;
  
  fd = h->s[id].fd;
  if (fd == 0) {
    __assert_fail("fd != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/service-src/service_harbor.c"
                  ,0x180,"void dispatch_queue(struct harbor *, int)");
  }
  queue = h->s[id].queue;
  if (queue != (harbor_msg_queue *)0x0) {
    while (iVar1 = queue->head, iVar1 != queue->tail) {
      phVar2 = queue->data;
      queue->head = (iVar1 + 1) % queue->size;
      if (phVar2 == (harbor_msg *)0x0) break;
      send_remote(h->ctx,fd,(char *)phVar2[iVar1].buffer,phVar2[iVar1].size,&phVar2[iVar1].header);
      free(phVar2[iVar1].buffer);
    }
    release_queue(queue);
    h->s[id].queue = (harbor_msg_queue *)0x0;
  }
  return;
}

Assistant:

static void
dispatch_queue(struct harbor *h, int id) {
	struct slave *s = &h->s[id];
	int fd = s->fd;
	assert(fd != 0);

	struct harbor_msg_queue *queue = s->queue;
	if (queue == NULL)
		return;

	struct harbor_msg * m;
	while ((m = pop_queue(queue)) != NULL) {
		send_remote(h->ctx, fd, m->buffer, m->size, &m->header);
		skynet_free(m->buffer);
	}
	release_queue(queue);
	s->queue = NULL;
}